

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O0

klass class_create(char *name,accessor_type_id accessor,class_impl impl,
                  class_impl_interface_singleton singleton)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  vector pvVar4;
  map pmVar5;
  set psVar6;
  code *in_RCX;
  class_impl in_RDX;
  accessor_type_id in_ESI;
  char *in_RDI;
  size_t cls_name_size;
  klass cls;
  class_interface local_50;
  klass local_8;
  
  local_8 = (klass)malloc(0x50);
  if (local_8 == (klass)0x0) {
    local_8 = (klass)0x0;
  }
  else {
    if (in_RDI == (char *)0x0) {
      local_8->name = (char *)0x0;
    }
    else {
      sVar2 = strlen(in_RDI);
      pcVar3 = (char *)malloc(sVar2 + 1);
      local_8->name = pcVar3;
      if (local_8->name == (char *)0x0) {
        log_write_impl_va("metacall",0x5f,"class_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                          ,3,"Invalid class name allocation <%s>",in_RDI);
        free(local_8);
        return (klass)0x0;
      }
      memcpy(local_8->name,in_RDI,sVar2 + 1);
    }
    local_8->impl = in_RDX;
    local_8->accessor = in_ESI;
    threading_atomic_ref_count_initialize((threading_atomic_ref_count)0x1094fb);
    if (in_RCX == (code *)0x0) {
      local_50 = (class_interface)0x0;
    }
    else {
      local_50 = (class_interface)(*in_RCX)();
    }
    local_8->interface = local_50;
    pvVar4 = (vector)vector_create(8);
    local_8->constructors = pvVar4;
    pmVar5 = (map)map_create(hash_callback_str,comparable_callback_str);
    local_8->methods = pmVar5;
    pmVar5 = (map)map_create(hash_callback_str,comparable_callback_str);
    local_8->static_methods = pmVar5;
    psVar6 = (set)set_create(hash_callback_str,comparable_callback_str);
    local_8->attributes = psVar6;
    psVar6 = (set)set_create(hash_callback_str,comparable_callback_str);
    local_8->static_attributes = psVar6;
    if (((local_8->interface == (class_interface)0x0) ||
        (local_8->interface->create == (class_impl_interface_create)0x0)) ||
       (iVar1 = (*local_8->interface->create)(local_8,in_RDX), iVar1 == 0)) {
      LOCK();
      class_stats.allocations = class_stats.allocations + 1;
      UNLOCK();
    }
    else {
      log_write_impl_va("metacall",0x7b,"class_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                        ,3,"Invalid class (%s) create callback <%p>",local_8->name,
                        local_8->interface->create);
      free(local_8->name);
      vector_destroy(local_8->constructors);
      map_destroy(local_8->methods);
      map_destroy(local_8->static_methods);
      set_destroy(local_8->attributes);
      set_destroy(local_8->static_attributes);
      free(local_8);
      local_8 = (klass)0x0;
    }
  }
  return local_8;
}

Assistant:

klass class_create(const char *name, enum accessor_type_id accessor, class_impl impl, class_impl_interface_singleton singleton)
{
	klass cls = malloc(sizeof(struct class_type));

	if (cls == NULL)
	{
		return NULL;
	}

	if (name != NULL)
	{
		size_t cls_name_size = strlen(name) + 1;

		cls->name = malloc(sizeof(char) * cls_name_size);

		if (cls->name == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class name allocation <%s>", name);

			free(cls);

			return NULL;
		}

		memcpy(cls->name, name, cls_name_size);
	}
	else
	{
		cls->name = NULL;
	}

	cls->impl = impl;
	cls->accessor = accessor;
	threading_atomic_ref_count_initialize(&cls->ref);
	cls->interface = singleton ? singleton() : NULL;
	cls->constructors = vector_create_type(constructor);
	cls->methods = map_create(&hash_callback_str, &comparable_callback_str);
	cls->static_methods = map_create(&hash_callback_str, &comparable_callback_str);
	cls->attributes = set_create(&hash_callback_str, &comparable_callback_str);
	cls->static_attributes = set_create(&hash_callback_str, &comparable_callback_str);

	if (cls->interface != NULL && cls->interface->create != NULL)
	{
		if (cls->interface->create(cls, impl) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class (%s) create callback <%p>", cls->name, cls->interface->create);

			free(cls->name);
			vector_destroy(cls->constructors);
			map_destroy(cls->methods);
			map_destroy(cls->static_methods);
			set_destroy(cls->attributes);
			set_destroy(cls->static_attributes);
			free(cls);

			return NULL;
		}
	}

	reflect_memory_tracker_allocation(class_stats);

	return cls;
}